

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hash.c
# Opt level: O0

int main(int argc,char **argv)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  time_t tVar8;
  sx_alloc *alloc_00;
  sx_hashtbl *tbl_00;
  void *pvVar9;
  uint64_t uVar10;
  sx__hashtbl2 *tbl_01;
  double dVar11;
  double dVar12;
  int r_1;
  int index_1;
  int i_4;
  str_item *item_2;
  int i_3;
  sx__hashtbl2 *tbl2;
  int r;
  int index;
  int i_2;
  str_item *item_1;
  int i_1;
  uint64_t delta_tm;
  uint64_t start_tm;
  int local_60;
  char ch;
  int ii;
  int num_chars;
  str_item *item;
  int i;
  str_item *items;
  sx_hashtbl *tbl;
  sx_alloc *alloc;
  undefined1 local_28 [4];
  int num_samples;
  sx_rng rng;
  char **argv_local;
  int argc_local;
  
  rng.state[1] = (uint64_t)argv;
  tVar8 = time((time_t *)0x0);
  sx_rng_seed((sx_rng *)local_28,(uint32_t)tVar8);
  sx_tm_init();
  alloc_00 = sx_alloc_malloc();
  tbl_00 = sx_hashtbl_create(alloc_00,10000);
  if (tbl_00 == (sx_hashtbl *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x79,"tbl");
    pcVar1 = (code *)swi(3);
    iVar3 = (*pcVar1)();
    return iVar3;
  }
  pvVar9 = sx__malloc(alloc_00,320000,0,(char *)0x0,(char *)0x0,0);
  if (pvVar9 == (void *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                      ,0x7d,"items");
    pcVar1 = (code *)swi(3);
    iVar3 = (*pcVar1)();
    return iVar3;
  }
  puts("Generating random strings ...");
  for (item._4_4_ = 0; item._4_4_ < 10000; item._4_4_ = item._4_4_ + 1) {
    iVar3 = sx_rng_gen_rangei((sx_rng *)local_28,0x10,0x1f);
    for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
      iVar4 = sx_rng_gen_rangei((sx_rng *)local_28,0x30,0x7a);
      cVar2 = (char)iVar4;
      if ((cVar2 < '0') || ('z' < cVar2)) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                          ,0x85,"ch >= 48 && ch <= 122");
        pcVar1 = (code *)swi(3);
        iVar3 = (*pcVar1)();
        return iVar3;
      }
      *(char *)((long)pvVar9 + (long)local_60 + (long)item._4_4_ * 0x20) = cVar2;
    }
    *(undefined1 *)((long)pvVar9 + (long)iVar3 + (long)item._4_4_ * 0x20) = 0;
  }
  puts("sx_hashtbl:");
  puts("\tPushing into hash table ...");
  uVar10 = sx_tm_now();
  for (item_1._4_4_ = 0; item_1._4_4_ < 10000; item_1._4_4_ = item_1._4_4_ + 1) {
    uVar5 = sx_hash_fnv32_str((char *)((long)pvVar9 + (long)item_1._4_4_ * 0x20));
    sx_hashtbl_add(tbl_00,uVar5,item_1._4_4_);
  }
  uVar10 = sx_tm_since(uVar10);
  dVar11 = sx_tm_ms(uVar10);
  dVar12 = sx_tm_sec(uVar10);
  printf("\tTook %lf ms (%lf secs)\n",dVar11,SUB84(dVar12,0));
  puts("\tSearching for random items ...");
  uVar10 = sx_tm_now();
  for (r = 0; r < 10000; r = r + 1) {
    uVar6 = sx_rng_gen_rangei((sx_rng *)local_28,0,9999);
    uVar5 = sx_hash_fnv32_str((char *)((long)pvVar9 + (long)(int)uVar6 * 0x20));
    uVar7 = sx_hashtbl_find_get(tbl_00,uVar5,-1);
    if ((uVar7 == uVar6) || (uVar7 == 0xffffffff)) {
      if (uVar7 == 0xffffffff) {
        printf("\tERROR: Item not found: %s (index: %d)\n",
               (void *)((long)pvVar9 + (long)(int)uVar6 * 0x20),(ulong)uVar6);
      }
    }
    else {
      printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
             ,(void *)((long)pvVar9 + (long)(int)uVar6 * 0x20),(ulong)uVar6,
             (void *)((long)pvVar9 + (long)(int)uVar7 * 0x20),(ulong)uVar7);
    }
  }
  uVar10 = sx_tm_since(uVar10);
  dVar11 = sx_tm_ms(uVar10);
  dVar12 = sx_tm_sec(uVar10);
  printf("\tTook %lf ms (%lf secs)\n",dVar11,SUB84(dVar12,0));
  printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)(uint)tbl_00->_miss_cnt,
         (ulong)(uint)tbl_00->_probe_cnt);
  tbl_01 = sx__hashtbl2_create(alloc_00,10000);
  if (tbl_01 != (sx__hashtbl2 *)0x0) {
    puts("sx_hashtbl2:");
    puts("\tPushing into hash table ...");
    uVar10 = sx_tm_now();
    for (item_2._4_4_ = 0; item_2._4_4_ < 10000; item_2._4_4_ = item_2._4_4_ + 1) {
      uVar5 = sx_hash_fnv32_str((char *)((long)pvVar9 + (long)item_2._4_4_ * 0x20));
      sx__hashtbl2_add(tbl_01,uVar5,item_2._4_4_);
    }
    uVar10 = sx_tm_since(uVar10);
    dVar11 = sx_tm_ms(uVar10);
    dVar12 = sx_tm_sec(uVar10);
    printf("\tTook %lf ms (%lf secs)\n",dVar11,SUB84(dVar12,0));
    puts("\tSearching for random items ...");
    uVar10 = sx_tm_now();
    for (r_1 = 0; r_1 < 10000; r_1 = r_1 + 1) {
      uVar6 = sx_rng_gen_rangei((sx_rng *)local_28,0,9999);
      uVar5 = sx_hash_fnv32_str((char *)((long)pvVar9 + (long)(int)uVar6 * 0x20));
      uVar7 = sx__hashtbl2_find_get(tbl_01,uVar5,-1);
      if ((uVar7 == uVar6) || (uVar7 == 0xffffffff)) {
        if (uVar7 == 0xffffffff) {
          printf("\tERROR: Item not found: %s (index: %d)\n",
                 (void *)((long)pvVar9 + (long)(int)uVar6 * 0x20),(ulong)uVar6);
        }
      }
      else {
        printf("\tERROR: Invalid hash result:\n\t\tRequested item: %s (index: %d)\n\t\tGot Item: %s (index: %d)\n"
               ,(void *)((long)pvVar9 + (long)(int)uVar6 * 0x20),(ulong)uVar6,
               (void *)((long)pvVar9 + (long)(int)uVar7 * 0x20),(ulong)uVar7);
      }
    }
    uVar10 = sx_tm_since(uVar10);
    dVar11 = sx_tm_ms(uVar10);
    dVar12 = sx_tm_sec(uVar10);
    printf("\tTook %lf ms (%lf secs)\n",dVar11,SUB84(dVar12,0));
    printf("\tTotal miss count: %d\n\tTotal probe count: %d\n",(ulong)(uint)tbl_01->_miss_cnt,
           (ulong)(uint)tbl_01->_probe_cnt);
    sx_hashtbl_destroy(tbl_00,alloc_00);
    sx__hashtbl2_destroy(tbl_01,alloc_00);
    sx_os_getch();
    return 0;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-hash.c"
                    ,0xb0,"tbl2");
  pcVar1 = (code *)swi(3);
  iVar3 = (*pcVar1)();
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));
    sx_tm_init();

    const int num_samples = 10000;
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_hashtbl* tbl = sx_hashtbl_create(alloc, num_samples);
    sx_assert(tbl);

    // Make random string array
    str_item* items = (str_item*)sx_malloc(alloc, sizeof(str_item) * num_samples);
    sx_assert(items);

    puts("Generating random strings ...");
    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        int num_chars = sx_rng_gen_rangei(&rng, 16, sizeof(item->str) - 1);
        for (int ii = 0; ii < num_chars; ii++) {
            char ch = (char)sx_rng_gen_rangei(&rng, 48, 122);
            sx_assert(ch >= 48 && ch <= 122);
            item->str[ii] = ch;
        }
        item->str[num_chars] = 0;
    }

    uint64_t start_tm, delta_tm;
    puts("sx_hashtbl:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx_hashtbl_add(tbl, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx_hashtbl_find_get(tbl, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl->_miss_cnt,
               tbl->_probe_cnt);

    ////////////////////////////////////////////////////////////////////////////////////////////////
    // sx__hashtbl2
    sx__hashtbl2* tbl2 = sx__hashtbl2_create(alloc, num_samples);
    sx_assert(tbl2);

    puts("sx_hashtbl2:");
    puts("\tPushing into hash table ...");
    start_tm = sx_tm_now();

    for (int i = 0; i < num_samples; i++) {
        str_item* item = &items[i];
        sx__hashtbl2_add(tbl2, sx_hash_fnv32_str(item->str), i);
    }

    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));

    puts("\tSearching for random items ...");
    start_tm = sx_tm_now();
    for (int i = 0; i < num_samples; i++) {
        int index = sx_rng_gen_rangei(&rng, 0, num_samples - 1);
        int r = sx__hashtbl2_find_get(tbl2, sx_hash_fnv32_str(items[index].str), -1);
        if (r != index && r != -1) {
            printf(
                "\tERROR: Invalid hash result:\n"
                "\t\tRequested item: %s (index: %d)\n"
                "\t\tGot Item: %s (index: %d)\n",
                items[index].str, index, items[r].str, r);
        } else if (r == -1) {
            printf("\tERROR: Item not found: %s (index: %d)\n", items[index].str, index);
        }
    }
    delta_tm = sx_tm_since(start_tm);
    printf("\tTook %lf ms (%lf secs)\n", sx_tm_ms(delta_tm), sx_tm_sec(delta_tm));
    if (sx_enabled(SX_CONFIG_HASHTBL_DEBUG))
        printf("\tTotal miss count: %d\n\tTotal probe count: %d\n", tbl2->_miss_cnt,
               tbl2->_probe_cnt);

    sx_hashtbl_destroy(tbl, alloc);
    sx__hashtbl2_destroy(tbl2, alloc);

    sx_os_getch();
    return 0;
}